

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O3

void __thiscall
crnlib::vector<crnlib::vec<3U,_int>_>::reserve
          (vector<crnlib::vec<3U,_int>_> *this,uint new_capacity)

{
  vec<3U,_int> *p;
  uint uVar1;
  uint uVar2;
  uint min_new_capacity;
  vector<crnlib::vec<3U,_int>_> local_28;
  
  if (this->m_capacity < new_capacity) {
    elemental_vector::increase_capacity
              ((elemental_vector *)this,new_capacity,false,0xc,(object_mover)0x0,false);
    return;
  }
  if (new_capacity < this->m_capacity) {
    local_28.m_p = (vec<3U,_int> *)0x0;
    local_28.m_size = 0;
    local_28.m_capacity = 0;
    if (new_capacity < this->m_size) {
      new_capacity = this->m_size;
    }
    elemental_vector::increase_capacity
              ((elemental_vector *)&local_28,new_capacity,false,0xc,(object_mover)0x0,false);
    if (&local_28 == this) {
      uVar2 = this->m_size;
      uVar1 = local_28.m_size;
    }
    else {
      min_new_capacity = this->m_size;
      if (local_28.m_capacity < min_new_capacity) {
        if (local_28.m_p != (vec<3U,_int> *)0x0) {
          crnlib_free(local_28.m_p);
          local_28.m_p = (vec<3U,_int> *)0x0;
          local_28.m_size = 0;
          local_28.m_capacity = 0;
          min_new_capacity = this->m_size;
        }
        elemental_vector::increase_capacity
                  ((elemental_vector *)&local_28,min_new_capacity,false,0xc,(object_mover)0x0,false)
        ;
        min_new_capacity = this->m_size;
      }
      else if (local_28.m_size != 0) {
        local_28._8_8_ = (ulong)local_28.m_capacity << 0x20;
      }
      memcpy(local_28.m_p,this->m_p,(ulong)min_new_capacity * 0xc);
      uVar2 = this->m_size;
      uVar1 = uVar2;
    }
    p = this->m_p;
    this->m_p = local_28.m_p;
    this->m_size = uVar1;
    uVar1 = this->m_capacity;
    this->m_capacity = local_28.m_capacity;
    local_28.m_capacity = uVar1;
    local_28.m_size = uVar2;
    if (p != (vec<3U,_int> *)0x0) {
      local_28.m_p = p;
      crnlib_free(p);
    }
  }
  return;
}

Assistant:

inline void reserve(uint new_capacity)
        {
            if (new_capacity > m_capacity)
            {
                increase_capacity(new_capacity, false);
            }
            else if (new_capacity < m_capacity)
            {
                // Must work around the lack of a "decrease_capacity()" method.
                // This case is rare enough in practice that it's probably not worth implementing an optimized in-place resize.
                vector tmp;
                tmp.increase_capacity(math::maximum(m_size, new_capacity), false);
                tmp = *this;
                swap(tmp);
            }
        }